

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprFirst(Fts5Expr *p,Fts5Index *pIdx,i64 iFirst,int bDesc)

{
  Fts5ExprNode *pFVar1;
  int iVar2;
  int in_ECX;
  Fts5ExprNode *in_RDX;
  Fts5Index *in_RSI;
  Fts5Expr *in_RDI;
  int rc;
  Fts5ExprNode *pRoot;
  int local_2c;
  
  pFVar1 = in_RDI->pRoot;
  in_RDI->pIndex = in_RSI;
  in_RDI->bDesc = in_ECX;
  local_2c = fts5ExprNodeFirst((Fts5Expr *)in_RSI,in_RDX);
  if (((local_2c == 0) && (pFVar1->bEof == 0)) &&
     (iVar2 = fts5RowidCmp(in_RDI,pFVar1->iRowid,(i64)in_RDX), iVar2 < 0)) {
    local_2c = (*pFVar1->xNext)(in_RDI,pFVar1,1,(i64)in_RDX);
  }
  while (pFVar1->bNomatch != 0 && local_2c == 0) {
    local_2c = (*pFVar1->xNext)(in_RDI,pFVar1,0,0);
  }
  return local_2c;
}

Assistant:

static int sqlite3Fts5ExprFirst(Fts5Expr *p, Fts5Index *pIdx, i64 iFirst, int bDesc){
  Fts5ExprNode *pRoot = p->pRoot;
  int rc;                         /* Return code */

  p->pIndex = pIdx;
  p->bDesc = bDesc;
  rc = fts5ExprNodeFirst(p, pRoot);

  /* If not at EOF but the current rowid occurs earlier than iFirst in
  ** the iteration order, move to document iFirst or later. */
  if( rc==SQLITE_OK
   && 0==pRoot->bEof
   && fts5RowidCmp(p, pRoot->iRowid, iFirst)<0
  ){
    rc = fts5ExprNodeNext(p, pRoot, 1, iFirst);
  }

  /* If the iterator is not at a real match, skip forward until it is. */
  while( pRoot->bNomatch && rc==SQLITE_OK ){
    assert( pRoot->bEof==0 );
    rc = fts5ExprNodeNext(p, pRoot, 0, 0);
  }
  return rc;
}